

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::PushLoopBlockBarrier(cmMakefile *this)

{
  _Elt_pointer piVar1;
  uint in_EAX;
  undefined8 uStack_8;
  
  uStack_8 = (ulong)in_EAX;
  piVar1 = (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar1 == (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<int,_std::allocator<int>_>::_M_push_back_aux<int>
              (&(this->LoopBlockCounter).c,(int *)((long)&uStack_8 + 4));
  }
  else {
    *piVar1 = 0;
    (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
    super__Deque_impl_data._M_finish._M_cur = piVar1 + 1;
  }
  return;
}

Assistant:

void cmMakefile::PushLoopBlockBarrier()
{
  this->LoopBlockCounter.push(0);
}